

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O3

int If_LogCreateAndXorMulti(Vec_Int_t *vAig,int *pFaninLits,int nFanins,int nSuppAll,int fXor)

{
  uint Entry;
  uint Entry_00;
  bool bVar1;
  int iVar2;
  
  if (1 < nFanins) {
    do {
      Entry = pFaninLits[nFanins - 1U];
      if ((int)Entry < 0) {
LAB_0041d68f:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      Entry_00 = pFaninLits[(ulong)(uint)nFanins - 2];
      if ((int)Entry_00 < 0) goto LAB_0041d68f;
      if ((Entry_00 ^ Entry) < 2) {
        __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                      ,0x3c,"int If_LogCreateAnd(Vec_Int_t *, int, int, int)");
      }
      iVar2 = vAig->nSize;
      Vec_IntPush(vAig,Entry);
      Vec_IntPush(vAig,Entry_00);
      iVar2 = iVar2 / 2 + nSuppAll;
      if (iVar2 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pFaninLits[(ulong)(uint)nFanins - 2] = iVar2 * 2;
      bVar1 = 2 < (uint)nFanins;
      nFanins = nFanins - 1U;
    } while (bVar1);
  }
  return *pFaninLits;
}

Assistant:

static inline int If_LogCreateAndXorMulti( Vec_Int_t * vAig, int * pFaninLits, int nFanins, int nSuppAll, int fXor )
{
    int i;
    assert( nFanins > 0 );
    for ( i = nFanins - 1; i > 0; i-- )
        pFaninLits[i-1] = If_LogCreateAndXor( vAig, pFaninLits[i], pFaninLits[i-1], nSuppAll, fXor );
    return pFaninLits[0];
}